

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

void AdjustOpenGLLogicalScalingVector(int *x,int *y,float *rx,float *ry)

{
  SDL20_floor_t *pp_Var1;
  undefined4 unaff_EBP;
  uint uVar2;
  SDL20_floor_t *pp_Var3;
  int iVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  SDL_Rect SVar12;
  int physical_h;
  int physical_w;
  int local_50;
  int local_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined1 auVar10 [16];
  
  if (VideoWindow20 != (SDL_Window *)0x0 && OpenGLLogicalScalingFBO != 0) {
    (*SDL20_GetWindowSize)(VideoWindow20,&local_4c,&local_50);
    SVar12 = GetOpenGLLogicalScalingViewport(local_4c,local_50);
    pp_Var3 = &SDL20_floor;
    auVar8._0_4_ = (float)OpenGLLogicalScalingHeight;
    auVar8._4_4_ = (float)OpenGLLogicalScalingWidth;
    auVar8._8_8_ = 0;
    auVar9._0_4_ = (float)SVar12.h;
    auVar9._4_4_ = (float)SVar12.w;
    auVar9._8_8_ = 0;
    auVar9 = divps(auVar8,auVar9);
    local_48 = MouseRelativeRemainder_1 + (float)*y * auVar9._0_4_;
    fStack_44 = MouseRelativeRemainder_0 + (float)*x * auVar9._4_4_;
    fStack_40 = auVar9._8_4_ * 0.0 + 0.0;
    fStack_3c = auVar9._12_4_ * 0.0 + 0.0;
    iVar4 = -(uint)(local_48 < 0.0);
    iVar5 = -(uint)(fStack_44 < 0.0);
    auVar11._4_4_ = iVar5;
    auVar11._0_4_ = iVar4;
    auVar11._8_4_ = iVar5;
    auVar11._12_4_ = iVar5;
    auVar10._8_8_ = auVar11._8_8_;
    auVar10._4_4_ = iVar4;
    auVar10._0_4_ = iVar4;
    uVar2 = movmskpd(unaff_EBP,auVar10);
    pp_Var1 = &SDL20_floor;
    if ((uVar2 & 2) != 0) {
      pp_Var1 = &SDL20_ceil;
    }
    local_38 = fStack_44;
    fStack_34 = fStack_44;
    fStack_30 = fStack_44;
    fStack_2c = fStack_44;
    dVar6 = (**pp_Var1)((double)fStack_44);
    if ((uVar2 & 1) != 0) {
      pp_Var3 = &SDL20_ceil;
    }
    dVar7 = (**pp_Var3)((double)local_48);
    *x = (int)dVar6;
    *y = (int)dVar7;
    MouseRelativeRemainder_0 = local_38 - (float)dVar6;
    MouseRelativeRemainder_1 = local_48 - (float)dVar7;
  }
  return;
}

Assistant:

static void
AdjustOpenGLLogicalScalingVector(int *x, int *y, float *rx, float *ry)
{
    SDL_Rect viewport;
    int physical_w, physical_h;
    float scale_x, scale_y;
    float float_x, float_y;
    float trunc_x, trunc_y;

    /* Don't adjust anything if we're not using Logical Scaling */
    if (!OpenGLLogicalScalingFBO || !VideoWindow20) {
        return;
    }

    /* we want to scale based on the window size, which is dpi-scaled */
    SDL20_GetWindowSize(VideoWindow20, &physical_w, &physical_h);
    viewport = GetOpenGLLogicalScalingViewport(physical_w, physical_h);

    scale_x = (float)OpenGLLogicalScalingWidth / viewport.w;
    scale_y = (float)OpenGLLogicalScalingHeight / viewport.h;

    float_x = *x * scale_x + (rx ? *rx : 0.f);
    float_y = *y * scale_y + (ry ? *ry : 0.f);

    trunc_x = SDL20_truncf(float_x);
    trunc_y = SDL20_truncf(float_y);

    *x = (int)trunc_x;
    *y = (int)trunc_y;

    if (rx) {
        *rx = float_x - trunc_x;
    }
    if (ry) {
        *ry = float_y - trunc_y;
    }
}